

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

double __thiscall icu_63::Formattable::getDouble(Formattable *this,UErrorCode *status)

{
  UObject *a;
  UBool UVar1;
  
  if (U_ZERO_ERROR < *status) {
    return 0.0;
  }
LAB_0021ad7f:
  switch(this->fType) {
  case kDouble:
    return (double)(this->fValue).fObject;
  case kLong:
  case kInt64:
    return (double)(this->fValue).fInt64;
  default:
    goto switchD_0021ad91_caseD_3;
  case kObject:
    break;
  }
  a = (this->fValue).fObject;
  if (a == (UObject *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return 0.0;
  }
  UVar1 = instanceOfMeasure(a);
  this = (Formattable *)(a + 1);
  if (UVar1 == '\0') {
switchD_0021ad91_caseD_3:
    *status = U_INVALID_FORMAT_ERROR;
    return 0.0;
  }
  goto LAB_0021ad7f;
}

Assistant:

double
Formattable::getDouble(UErrorCode& status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
        
    switch (fType) {
    case Formattable::kLong: 
    case Formattable::kInt64: // loses precision
        return (double)fValue.fInt64;
    case Formattable::kDouble:
        return fValue.fDouble;
    case Formattable::kObject:
        if (fValue.fObject == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }
        // TODO Later replace this with instanceof call
        if (instanceOfMeasure(fValue.fObject)) {
            return ((const Measure*) fValue.fObject)->
                getNumber().getDouble(status);
        }
        U_FALLTHROUGH;
    default:
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
}